

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QString>::reallocate
          (QMovableArrayOps<QString> *this,qsizetype alloc,AllocationOption option)

{
  undefined1 auVar1 [16];
  
  auVar1 = QArrayData::reallocateUnaligned
                     (&((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d)
                       ->super_QArrayData,
                      (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr,
                      0x18,alloc,option);
  if (auVar1._8_8_ != 0) {
    (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d =
         (Data *)auVar1._0_8_;
    (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr =
         (QString *)auVar1._8_8_;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }